

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O2

void __thiscall
ConfidentialTxInReference_EstimateTxInVsize_Test::TestBody
          (ConfidentialTxInReference_EstimateTxInVsize_Test *this)

{
  AddressType addr_type;
  int minimum_bits;
  Script claim_script;
  bool bVar1;
  int iVar2;
  long lVar3;
  Script *pSVar4;
  char *message;
  pointer tx_in;
  initializer_list<TestEstimateConfidentialTxInRefVector> __l;
  undefined8 uStack_2328;
  undefined4 uStack_2318;
  uint32_t vsize;
  undefined1 auStack_2310 [16];
  AssertionResult gtest_ar;
  vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
  test_vector;
  AssertHelper local_22b8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_22b0;
  Script script_template;
  BlindFactor blind_factor;
  BlindFactor entropy;
  ConfidentialValue issuance_amount;
  Amount token_amount;
  Amount issue_amount;
  ConfidentialValue inflation_keys;
  ConfidentialTxIn issue_txin;
  ScriptWitness local_2050;
  ScriptWitness local_2030;
  ScriptWitness local_2010;
  ScriptWitness local_1ff0;
  ScriptWitness local_1fd0;
  ScriptWitness local_1fb0;
  Script local_1f90;
  ConfidentialTxIn reissue_txin;
  ConfidentialTxIn pegin_txin;
  ConfidentialTxIn txin;
  Script local_1b38;
  ConfidentialTxInReference txin_ref;
  Script local_1990;
  Script local_1958;
  bool local_1920;
  string local_1918 [32];
  undefined8 local_18f8;
  ConfidentialTxIn local_18f0;
  undefined8 local_1790;
  undefined4 local_1788;
  Script local_1780;
  Script local_1748;
  undefined1 local_1710;
  string local_1708 [32];
  undefined8 local_16e8;
  ConfidentialTxIn local_16e0;
  undefined8 local_1580;
  undefined4 local_1578;
  Script local_1570;
  Script local_1538;
  undefined1 local_1500;
  string local_14f8 [32];
  undefined8 local_14d8;
  ConfidentialTxIn local_14d0;
  undefined8 local_1370;
  undefined4 local_1368;
  Script local_1360;
  Script local_1328;
  undefined1 local_12f0;
  string local_12e8 [32];
  undefined8 local_12c8;
  ConfidentialTxIn local_12c0;
  undefined8 local_1160;
  undefined4 local_1158;
  Script local_1150;
  Script local_1118;
  undefined1 local_10e0;
  string local_10d8 [32];
  undefined8 local_10b8;
  ConfidentialTxIn local_10b0;
  undefined8 local_f50;
  undefined4 local_f48;
  Script local_f40;
  Script local_f08;
  undefined1 local_ed0;
  string local_ec8 [32];
  undefined8 local_ea8;
  ConfidentialTxIn local_ea0;
  undefined8 local_d40;
  undefined4 local_d38;
  Script local_d30;
  Script local_cf8;
  undefined1 local_cc0;
  string local_cb8 [32];
  undefined8 local_c98;
  ConfidentialTxIn local_c90;
  undefined8 local_b30;
  undefined4 local_b28;
  Script local_b20;
  Script local_ae8;
  undefined1 local_ab0;
  string local_aa8 [32];
  undefined8 local_a88;
  ConfidentialTxIn local_a80;
  undefined8 local_920;
  undefined4 local_918;
  Script local_910;
  Script local_8d8;
  undefined1 local_8a0;
  string local_898 [32];
  undefined8 local_878;
  ConfidentialTxIn local_870;
  undefined8 local_710;
  undefined4 local_708;
  Script local_700;
  Script local_6c8;
  undefined1 local_690;
  string local_688 [32];
  undefined8 local_668;
  ConfidentialTxIn local_660;
  undefined8 local_500;
  undefined4 local_4f8;
  Script local_4f0;
  Script local_4b8;
  undefined1 local_480;
  string local_478 [32];
  undefined8 local_458;
  ConfidentialTxIn local_450;
  undefined8 local_2f0;
  undefined4 local_2e8;
  Script local_2e0;
  Script local_2a8;
  undefined1 local_270;
  string local_268 [32];
  undefined8 local_248;
  ConfidentialTxIn local_240;
  undefined8 local_e0;
  undefined4 local_d8;
  Script local_d0;
  Script local_98;
  undefined1 local_60;
  string local_58 [32];
  undefined8 local_38;
  
  if (TestBody()::multisig_script_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&TestBody()::multisig_script_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&TestBody()::multisig_script_abi_cxx11_,
                 "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
                 ,(allocator *)&txin_ref);
      __cxa_atexit(std::__cxx11::string::~string,&TestBody()::multisig_script_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&TestBody()::multisig_script_abi_cxx11_);
    }
  }
  cfd::core::Amount::Amount(&issue_amount,10000000);
  cfd::core::Amount::Amount(&token_amount,10000000);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&txin);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&pegin_txin);
  std::__cxx11::string::string((string *)&txin_ref,"00e1f50500000000",(allocator *)&reissue_txin);
  cfd::core::ByteData::ByteData((ByteData *)&issue_txin,(string *)&txin_ref);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_1fb0,&pegin_txin,(ByteData *)&issue_txin)
  ;
  cfd::core::ScriptWitness::~ScriptWitness(&local_1fb0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&issue_txin);
  std::__cxx11::string::~string((string *)&txin_ref);
  std::__cxx11::string::string
            ((string *)&txin_ref,"c23bd031406aa9f7ac994f7385cd8d2605adaadf5a473c82557b4586192681d3",
             (allocator *)&reissue_txin);
  cfd::core::ByteData::ByteData((ByteData *)&issue_txin,(string *)&txin_ref);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_1fd0,&pegin_txin,(ByteData *)&issue_txin)
  ;
  cfd::core::ScriptWitness::~ScriptWitness(&local_1fd0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&issue_txin);
  std::__cxx11::string::~string((string *)&txin_ref);
  std::__cxx11::string::string
            ((string *)&txin_ref,"06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f",
             (allocator *)&reissue_txin);
  cfd::core::ByteData::ByteData((ByteData *)&issue_txin,(string *)&txin_ref);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_1ff0,&pegin_txin,(ByteData *)&issue_txin)
  ;
  cfd::core::ScriptWitness::~ScriptWitness(&local_1ff0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&issue_txin);
  std::__cxx11::string::~string((string *)&txin_ref);
  std::__cxx11::string::string
            ((string *)&txin_ref,"0014e8d28b573816ddfcf98578d7b28543e273f5a72a",
             (allocator *)&reissue_txin);
  cfd::core::ByteData::ByteData((ByteData *)&issue_txin,(string *)&txin_ref);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_2010,&pegin_txin,(ByteData *)&issue_txin)
  ;
  cfd::core::ScriptWitness::~ScriptWitness(&local_2010);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&issue_txin);
  std::__cxx11::string::~string((string *)&txin_ref);
  std::__cxx11::string::string
            ((string *)&txin_ref,
             "02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000"
             ,(allocator *)&reissue_txin);
  cfd::core::ByteData::ByteData((ByteData *)&issue_txin,(string *)&txin_ref);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_2030,&pegin_txin,(ByteData *)&issue_txin)
  ;
  cfd::core::ScriptWitness::~ScriptWitness(&local_2030);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&issue_txin);
  std::__cxx11::string::~string((string *)&txin_ref);
  std::__cxx11::string::string
            ((string *)&txin_ref,
             "03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105"
             ,(allocator *)&reissue_txin);
  cfd::core::ByteData::ByteData((ByteData *)&issue_txin,(string *)&txin_ref);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_2050,&pegin_txin,(ByteData *)&issue_txin)
  ;
  cfd::core::ScriptWitness::~ScriptWitness(&local_2050);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&issue_txin);
  std::__cxx11::string::~string((string *)&txin_ref);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&issue_txin);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&reissue_txin);
  cfd::core::ConfidentialValue::ConfidentialValue(&issuance_amount,&issue_amount);
  cfd::core::ConfidentialValue::ConfidentialValue(&inflation_keys,&token_amount);
  std::__cxx11::string::string
            ((string *)&txin_ref,"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",
             (allocator *)&script_template);
  cfd::core::BlindFactor::BlindFactor(&entropy,(string *)&txin_ref);
  std::__cxx11::string::~string((string *)&txin_ref);
  std::__cxx11::string::string
            ((string *)&txin_ref,"c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf",
             (allocator *)&script_template);
  cfd::core::BlindFactor::BlindFactor(&blind_factor,(string *)&txin_ref);
  std::__cxx11::string::~string((string *)&txin_ref);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&txin_ref);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&script_template);
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar);
  cfd::core::ByteData::ByteData((ByteData *)&test_vector);
  cfd::core::ConfidentialTxIn::SetIssuance
            (&issue_txin,(ByteData256 *)&txin_ref,(ByteData256 *)&script_template,&issuance_amount,
             &inflation_keys,(ByteData *)&gtest_ar,(ByteData *)&test_vector);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&test_vector);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script_template);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txin_ref);
  cfd::core::BlindFactor::GetData((ByteData256 *)&script_template,&entropy);
  cfd::core::BlindFactor::GetData((ByteData256 *)&gtest_ar,&blind_factor);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&txin_ref);
  cfd::core::ByteData::ByteData((ByteData *)&test_vector);
  cfd::core::ByteData::ByteData((ByteData *)&local_22b0);
  cfd::core::ConfidentialTxIn::SetIssuance
            (&reissue_txin,(ByteData256 *)&script_template,(ByteData256 *)&gtest_ar,&issuance_amount
             ,(ConfidentialValue *)&txin_ref,(ByteData *)&test_vector,(ByteData *)&local_22b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_22b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&test_vector);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&txin_ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script_template);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn((ConfidentialTxIn *)&txin_ref,&txin);
  cfd::core::Script::Script(&local_1990);
  cfd::core::Script::Script(&local_1958);
  local_1920 = false;
  std::__cxx11::string::string(local_1918,"",(allocator *)&local_22b0);
  local_18f8._0_4_ = 0;
  local_18f8._4_4_ = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_18f0,&txin);
  local_1790 = 0xcd00000001;
  local_1788 = 0;
  cfd::core::Script::Script(&local_1780,&exp_script);
  cfd::core::Script::Script(&local_1748);
  local_1710 = 0;
  std::__cxx11::string::string(local_1708,"",(allocator *)&local_22b8);
  local_16e8 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_16e0,&txin);
  local_1580 = 0x5c00000006;
  local_1578 = 0;
  cfd::core::Script::Script(&local_1570);
  cfd::core::Script::Script(&local_1538);
  local_1500 = 0;
  std::__cxx11::string::string(local_14f8,"",(allocator *)&vsize);
  local_14d8 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_14d0,&txin);
  local_1370 = 0x7100000005;
  local_1368 = 0;
  std::__cxx11::string::string((string *)&script_template,"51",(allocator *)(auStack_2310 + 0xf));
  cfd::core::Script::Script(&local_1360,(string *)&script_template);
  cfd::core::Script::Script(&local_1328);
  local_12f0 = 0;
  std::__cxx11::string::string(local_12e8,"",(allocator *)(auStack_2310 + 0xe));
  local_12c8 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_12c0,&txin);
  local_1160 = 0x4500000004;
  local_1158 = 0;
  cfd::core::Script::Script(&local_1150);
  cfd::core::Script::Script(&local_1118);
  local_10e0 = 0;
  std::__cxx11::string::string(local_10d8,"",(allocator *)(auStack_2310 + 0xd));
  local_10b8 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_10b0,&txin);
  local_f50 = 0x5300000003;
  local_f48 = 0;
  cfd::core::Script::Script(&local_f40,&exp_script);
  cfd::core::Script::Script(&local_f08);
  local_ed0 = 0;
  std::__cxx11::string::string(local_ec8,"",(allocator *)(auStack_2310 + 0xc));
  local_ea8 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_ea0,&txin);
  local_d40 = 0x6a00000003;
  local_d38 = 0;
  cfd::core::Script::Script(&local_d30,&TestBody()::multisig_script_abi_cxx11_);
  cfd::core::Script::Script(&local_cf8);
  local_cc0 = 0;
  std::__cxx11::string::string(local_cb8,"",(allocator *)(auStack_2310 + 0xb));
  local_c98 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_c90,&pegin_txin);
  local_b30 = 0xc000000004;
  local_b28 = 0;
  cfd::core::Script::Script(&local_b20);
  std::__cxx11::string::string
            ((string *)&gtest_ar,
             "0020e8d28b573816ddfcf98578d7b28543e273f5a72a112233445566778899aabbccdd",
             (allocator *)(auStack_2310 + 10));
  cfd::core::Script::Script(&local_ae8,(string *)&gtest_ar);
  local_ab0 = 0;
  std::__cxx11::string::string(local_aa8,"",(allocator *)(auStack_2310 + 9));
  local_a88 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_a80,&issue_txin);
  local_920 = 0x48c00000004;
  local_918 = 0;
  cfd::core::Script::Script(&local_910);
  cfd::core::Script::Script(&local_8d8);
  local_8a0 = 1;
  std::__cxx11::string::string(local_898,"",(allocator *)(auStack_2310 + 8));
  local_878 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_870,&issue_txin);
  local_710 = 0x66d00000004;
  local_708 = 0;
  cfd::core::Script::Script(&local_700);
  cfd::core::Script::Script(&local_6c8);
  local_690 = 1;
  std::__cxx11::string::string(local_688,"",(allocator *)(auStack_2310 + 7));
  local_668 = 0x2400000000;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_660,&issue_txin);
  local_500 = 0x8ed00000004;
  local_4f8 = 0;
  cfd::core::Script::Script(&local_4f0);
  cfd::core::Script::Script(&local_4b8);
  local_480 = 1;
  std::__cxx11::string::string(local_478,"",(allocator *)(auStack_2310 + 6));
  local_458 = 0x3400000000;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_450,&reissue_txin);
  local_2f0 = 0x39a00000004;
  local_2e8 = 0;
  cfd::core::Script::Script(&local_2e0);
  cfd::core::Script::Script(&local_2a8);
  local_270 = 1;
  std::__cxx11::string::string(local_268,"",(allocator *)(auStack_2310 + 5));
  local_248 = 0x2400000000;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_240,&reissue_txin);
  local_e0 = 0x4da00000004;
  local_d8 = 0;
  cfd::core::Script::Script(&local_d0);
  cfd::core::Script::Script(&local_98);
  local_60 = 1;
  std::__cxx11::string::string(local_58,"",(allocator *)(auStack_2310 + 4));
  local_38 = 0x3400000000;
  __l._M_len = 0xd;
  __l._M_array = (iterator)&txin_ref;
  std::
  vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
  ::vector(&test_vector,__l,(allocator_type *)(auStack_2310 + 3));
  lVar3 = 0x18c0;
  do {
    TestEstimateConfidentialTxInRefVector::~TestEstimateConfidentialTxInRefVector
              ((TestEstimateConfidentialTxInRefVector *)
               ((long)&txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference + lVar3));
    lVar3 = lVar3 + -0x210;
  } while (lVar3 != -0x210);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&script_template);
  for (tx_in = test_vector.
               super__Vector_base<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
               ._M_impl.super__Vector_impl_data._M_start;
      tx_in != test_vector.
               super__Vector_base<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
               ._M_impl.super__Vector_impl_data._M_finish; tx_in = tx_in + 1) {
    vsize = 0;
    cfd::core::Script::Script(&script_template,&tx_in->script_template);
    pSVar4 = (Script *)(tx_in->script_template)._M_string_length;
    if (pSVar4 != (Script *)0x0) {
      pSVar4 = &script_template;
    }
    cfd::core::ConfidentialTxInReference::ConfidentialTxInReference(&txin_ref,&tx_in->txin);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        addr_type = tx_in->addr_type;
        cfd::core::Script::Script(&local_1f90,&tx_in->redeem_script);
        bVar1 = tx_in->is_blind;
        iVar2 = tx_in->exponent;
        minimum_bits = tx_in->minimum_bits;
        cfd::core::Script::Script(&local_1b38,&tx_in->claim_script);
        claim_script.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pSVar4;
        claim_script._vptr_Script = (_func_int **)&local_1b38;
        claim_script.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)uStack_2328;
        claim_script.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)test_vector.
                      super__Vector_base<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        claim_script.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = uStack_2318;
        claim_script.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = vsize;
        claim_script.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_2310._0_8_;
        claim_script.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_2310._8_8_;
        vsize = cfd::core::ConfidentialTxInReference::EstimateTxInVsize
                          (&txin_ref,addr_type,&local_1f90,bVar1,iVar2,minimum_bits,claim_script,
                           (Script *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        cfd::core::Script::~Script(&local_1b38);
        cfd::core::Script::~Script(&local_1f90);
      }
    }
    else {
      testing::Message::Message((Message *)&gtest_ar);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_22b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x226,
                 "Expected: (vsize = txin_ref.EstimateTxInVsize( test_data.addr_type, test_data.redeem_script, test_data.is_blind, test_data.exponent, test_data.minimum_bits, test_data.claim_script, template_ptr)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_22b0,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_22b0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"vsize","test_data.size",&vsize,&tx_in->size);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_22b0);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_22b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x227,message);
      testing::internal::AssertHelper::operator=(&local_22b8,(Message *)&local_22b0);
      testing::internal::AssertHelper::~AssertHelper(&local_22b8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_22b0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&txin_ref);
    cfd::core::Script::~Script(&script_template);
  }
  std::
  vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
  ::~vector(&test_vector);
  cfd::core::BlindFactor::~BlindFactor(&blind_factor);
  cfd::core::BlindFactor::~BlindFactor(&entropy);
  cfd::core::ConfidentialValue::~ConfidentialValue(&inflation_keys);
  cfd::core::ConfidentialValue::~ConfidentialValue(&issuance_amount);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&reissue_txin);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&issue_txin);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&pegin_txin);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin);
  return;
}

Assistant:

TEST(ConfidentialTxInReference, EstimateTxInVsize) {
  static const std::string multisig_script = "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae";

  Amount issue_amount(uint32_t{10000000});
  Amount token_amount(uint32_t{10000000});
  ConfidentialTxIn txin;
  ConfidentialTxIn pegin_txin;
  {
    pegin_txin.AddPeginWitnessStack(ByteData("00e1f50500000000"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "c23bd031406aa9f7ac994f7385cd8d2605adaadf5a473c82557b4586192681d3"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f"));
    pegin_txin.AddPeginWitnessStack(
        ByteData("0014e8d28b573816ddfcf98578d7b28543e273f5a72a"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105"));
  }
  ConfidentialTxIn issue_txin;
  ConfidentialTxIn reissue_txin;
  ConfidentialValue issuance_amount(issue_amount);
  ConfidentialValue inflation_keys(token_amount);
  BlindFactor entropy("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306");
  BlindFactor blind_factor("c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf");
  {
    issue_txin.SetIssuance(
        ByteData256(), ByteData256(), issuance_amount,
        inflation_keys, ByteData(), ByteData());
    reissue_txin.SetIssuance(
        entropy.GetData(), blind_factor.GetData(), issuance_amount,
        ConfidentialValue(), ByteData(), ByteData());
  }

  const std::vector<TestEstimateConfidentialTxInRefVector> test_vector = {
    {txin, AddressType::kP2pkhAddress, 150, 0, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2shAddress, 205, 0, exp_script, Script(), false, "", 0, 0},
    {txin, AddressType::kP2shP2wpkhAddress, 92, 0, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2shP2wshAddress, 113, 0, Script("51"), Script(), false, "", 0, 0},
    {txin, AddressType::kP2wpkhAddress, 69, 0, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2wshAddress, 83, 0, exp_script, Script(), false, "", 0, 0},
    {txin, AddressType::kP2wshAddress, 106, 0, Script(multisig_script), Script(), false, "", 0, 0},
    // pegin
    {pegin_txin, AddressType::kP2wpkhAddress, 192, 0, Script(),
     Script("0020e8d28b573816ddfcf98578d7b28543e273f5a72a112233445566778899aabbccdd"),
     false, "", 0, 0},
    // issue
    {issue_txin, AddressType::kP2wpkhAddress, 1164, 0, Script(), Script(), true, "", 0, 0},
    {issue_txin, AddressType::kP2wpkhAddress, 1645, 0, Script(), Script(), true, "", 0, 36},
    {issue_txin, AddressType::kP2wpkhAddress, 2285, 0, Script(), Script(), true, "", 0, 52},
    // reissue
    {reissue_txin, AddressType::kP2wpkhAddress, 922, 0, Script(),Script(), true, "", 0, 36},
    {reissue_txin, AddressType::kP2wpkhAddress, 1242, 0, Script(), Script(), true, "", 0, 52},
  };

  for (const auto& test_data : test_vector) {
    uint32_t vsize = 0;
    Script script_template(test_data.script_template);
    Script* template_ptr = nullptr;
    if (!test_data.script_template.empty()) {
      template_ptr = &script_template;
    }
    ConfidentialTxInReference txin_ref(test_data.txin);
    EXPECT_NO_THROW((vsize = txin_ref.EstimateTxInVsize(
        test_data.addr_type, test_data.redeem_script, test_data.is_blind,
        test_data.exponent, test_data.minimum_bits,
        test_data.claim_script, template_ptr)));
    EXPECT_EQ(vsize, test_data.size);
  }
}